

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u_debug.c
# Opt level: O0

uint64_t debug_get_flags_option(char *name,debug_named_value *flags,uint64_t dfault)

{
  debug_named_value *pdVar1;
  _Bool _Var2;
  int iVar3;
  char *__s1;
  size_t sVar4;
  char *pcVar5;
  char *local_78;
  uint local_50;
  uint local_3c;
  uint namealign;
  debug_named_value *orig;
  char *str;
  uint64_t result;
  uint64_t dfault_local;
  debug_named_value *flags_local;
  char *name_local;
  
  local_3c = 0;
  __s1 = os_get_option(name);
  str = (char *)dfault;
  if (__s1 != (char *)0x0) {
    iVar3 = strcmp(__s1,"help");
    dfault_local = (uint64_t)flags;
    if (iVar3 == 0) {
      _debug_printf("%s: help for %s:\n","debug_get_flags_option",name);
      for (; pdVar1 = flags, *(long *)dfault_local != 0; dfault_local = dfault_local + 0x18) {
        sVar4 = strlen(*(char **)dfault_local);
        if (sVar4 < local_3c) {
          local_50 = local_3c;
        }
        else {
          sVar4 = strlen(*(char **)dfault_local);
          local_50 = (uint)sVar4;
        }
        local_3c = local_50;
      }
      while (dfault_local = (uint64_t)pdVar1, *(long *)dfault_local != 0) {
        pcVar5 = "";
        if (*(long *)(dfault_local + 0x10) != 0) {
          pcVar5 = " ";
        }
        if (*(long *)(dfault_local + 0x10) == 0) {
          local_78 = "";
        }
        else {
          local_78 = *(char **)(dfault_local + 0x10);
        }
        _debug_printf("| %*s [0x%0*lx]%s%s\n",(ulong)local_3c,*(undefined8 *)dfault_local,0x10,
                      *(undefined8 *)(dfault_local + 8),pcVar5,local_78);
        pdVar1 = (debug_named_value *)(dfault_local + 0x18);
      }
    }
    else {
      str = (char *)0x0;
      for (; *(long *)dfault_local != 0; dfault_local = dfault_local + 0x18) {
        _Var2 = str_has_option(__s1,*(char **)dfault_local);
        if (_Var2) {
          str = (char *)(*(ulong *)(dfault_local + 8) | (ulong)str);
        }
      }
    }
  }
  _Var2 = debug_get_option_should_print();
  if (_Var2) {
    if (__s1 == (char *)0x0) {
      debug_printf("%s: %s = 0x%lx\n","debug_get_flags_option",name,str);
    }
    else {
      debug_printf("%s: %s = 0x%lx (%s)\n","debug_get_flags_option",name,str,__s1);
    }
  }
  return (uint64_t)str;
}

Assistant:

uint64_t
debug_get_flags_option(const char *name,
                       const struct debug_named_value *flags,
                       uint64_t dfault)
{
   uint64_t result;
   const char *str;
   const struct debug_named_value *orig = flags;
   unsigned namealign = 0;

   str = os_get_option(name);
   if (!str)
      result = dfault;
   else if (!strcmp(str, "help")) {
      result = dfault;
      _debug_printf("%s: help for %s:\n", __FUNCTION__, name);
      for (; flags->name; ++flags)
         namealign = MAX2(namealign, strlen(flags->name));
      for (flags = orig; flags->name; ++flags)
         _debug_printf("| %*s [0x%0*"PRIx64"]%s%s\n", namealign, flags->name,
                      (int)sizeof(uint64_t)*CHAR_BIT/4, flags->value,
                      flags->desc ? " " : "", flags->desc ? flags->desc : "");
   }
   else {
      result = 0;
      while (flags->name) {
	 if (str_has_option(str, flags->name))
	    result |= flags->value;
	 ++flags;
      }
   }

   if (debug_get_option_should_print()) {
      if (str) {
         debug_printf("%s: %s = 0x%"PRIx64" (%s)\n",
                      __FUNCTION__, name, result, str);
      } else {
         debug_printf("%s: %s = 0x%"PRIx64"\n", __FUNCTION__, name, result);
      }
   }

   return result;
}